

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

uint32_t __thiscall Buffer::CopyOut(Buffer *this,char *out,uint32_t l)

{
  ushort uVar1;
  ushort uVar2;
  BufferChain *pBVar3;
  bool bVar4;
  uint uVar5;
  BufferChain *pBVar6;
  uint32_t uVar7;
  ulong uVar8;
  uint32_t local_34;
  
  pBVar6 = this->m_head;
  uVar8 = 0;
  do {
    uVar7 = (uint32_t)uVar8;
    if (pBVar6 == (BufferChain *)0x0) {
      return uVar7;
    }
    uVar1 = pBVar6->write;
    uVar2 = pBVar6->read;
    if (uVar1 < uVar2) {
      __assert_fail("write >= read",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.cpp"
                    ,0x14,"uint16_t BufferChain::GetCanReadCount()");
    }
    if (uVar1 == uVar2) {
      pBVar3 = pBVar6->nextpkt;
      (*this->_vptr_Buffer[1])(this,pBVar6);
      this->m_head = pBVar3;
      bVar4 = true;
      pBVar6 = pBVar3;
      if (pBVar3 == (BufferChain *)0x0) {
        this->m_end = (BufferChain *)0x0;
      }
    }
    else {
      uVar5 = (uint)(ushort)(uVar1 - uVar2);
      if (l < uVar5) {
        if (0xfeb < uVar2) {
LAB_00105add:
          __assert_fail("read < _BUFFER_CHAIN_LEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.cpp"
                        ,8,"char *BufferChain::GetReadAddr()");
        }
        memcpy(out + uVar8,pBVar6->chain + uVar2,(ulong)l);
        uVar8 = (ulong)(uVar7 + l);
      }
      else {
        if (0xfeb < uVar2) goto LAB_00105add;
        memcpy(out + uVar8,pBVar6->chain + uVar2,(ulong)uVar5);
        uVar8 = (ulong)(uVar7 + uVar5);
        l = l - uVar5;
        if (l != 0) {
          pBVar6 = pBVar6->nextpkt;
          bVar4 = true;
          goto LAB_00105a9b;
        }
        l = 0;
      }
      bVar4 = false;
      local_34 = (uint32_t)uVar8;
    }
LAB_00105a9b:
    if (!bVar4) {
      return local_34;
    }
  } while( true );
}

Assistant:

uint32_t Buffer::CopyOut(char* out, uint32_t l)
{
    uint32_t ret = 0;
    for(BufferChain* buff = m_head; buff != nullptr; )
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* tmp = buff->nextpkt;
            Cycle(buff);
            buff = tmp;
            m_head = buff;
            if(m_head == nullptr)
                m_end = nullptr;
        }
        else
        {
            if(l < canReadCount)
            {
                memcpy(out + ret, buff->GetReadAddr(), l);
                ret += l;
                return ret;
            }
            else
            {
                memcpy(out + ret, buff->GetReadAddr(), canReadCount);
                ret += canReadCount;
                l -= canReadCount;

                if(l == 0)
                    return ret;

                buff = buff->nextpkt;
            }
        }
    }
    return ret;
}